

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aec_rdft.cc
# Opt level: O3

void cft1st_128_C(float *a)

{
  float *pfVar1;
  ulong uVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  fVar4 = (float)*(undefined8 *)a;
  fVar5 = (float)((ulong)*(undefined8 *)a >> 0x20);
  fVar6 = (float)*(undefined8 *)(a + 2);
  fVar8 = (float)((ulong)*(undefined8 *)(a + 2) >> 0x20);
  fVar11 = fVar4 - fVar6;
  fVar12 = fVar5 - fVar8;
  fVar4 = fVar4 + fVar6;
  fVar5 = fVar5 + fVar8;
  fVar13 = a[6] + a[4];
  fVar14 = a[7] + a[5];
  fVar6 = a[4] - a[6];
  fVar8 = a[5] - a[7];
  *a = fVar4 + fVar13;
  a[1] = fVar5 + fVar14;
  a[2] = fVar11 - fVar8;
  a[3] = fVar12 + fVar6;
  a[4] = fVar4 - fVar13;
  a[5] = fVar5 - fVar14;
  a[6] = fVar11 + fVar8;
  a[7] = fVar12 - fVar6;
  fVar4 = (float)*(undefined8 *)(a + 10);
  fVar5 = (float)((ulong)*(undefined8 *)(a + 10) >> 0x20);
  fVar13 = (float)*(undefined8 *)(a + 8);
  fVar14 = (float)((ulong)*(undefined8 *)(a + 8) >> 0x20);
  fVar11 = fVar13 + fVar4;
  fVar12 = fVar14 + fVar5;
  fVar13 = fVar13 - fVar4;
  fVar14 = fVar14 - fVar5;
  fVar4 = (float)*(undefined8 *)(a + 0xc);
  fVar6 = (float)((ulong)*(undefined8 *)(a + 0xc) >> 0x20);
  fVar7 = (float)*(undefined8 *)(a + 0xe);
  fVar5 = fVar4 - fVar7;
  fVar9 = (float)((ulong)*(undefined8 *)(a + 0xe) >> 0x20);
  fVar8 = fVar6 - fVar9;
  fVar17 = fVar13 - fVar8;
  fVar8 = fVar8 + fVar13;
  fVar4 = fVar4 + fVar7;
  fVar6 = fVar6 + fVar9;
  *(ulong *)(a + 8) = CONCAT44(fVar12 + fVar6,fVar11 + fVar4);
  *(ulong *)(a + 0xc) = CONCAT44(fVar11 - fVar4,fVar6 - fVar12);
  fVar4 = fVar14 + fVar5;
  a[10] = (fVar17 - fVar4) * 0.70710677;
  a[0xb] = (fVar4 + fVar17) * 0.70710677;
  fVar5 = fVar5 - fVar14;
  a[0xe] = (fVar5 - fVar8) * 0.70710677;
  a[0xf] = (fVar5 + fVar8) * 0.70710677;
  uVar2 = 0;
  lVar3 = 0;
  do {
    fVar4 = (float)*(undefined8 *)(a + lVar3 * 2 + 0x12);
    fVar5 = (float)((ulong)*(undefined8 *)(a + lVar3 * 2 + 0x12) >> 0x20);
    fVar20 = (float)*(undefined8 *)(a + lVar3 * 2 + 0x16);
    fVar21 = (float)((ulong)*(undefined8 *)(a + lVar3 * 2 + 0x16) >> 0x20);
    fVar17 = (float)*(undefined8 *)(a + lVar3 * 2 + 0x10);
    fVar10 = (float)((ulong)*(undefined8 *)(a + lVar3 * 2 + 0x10) >> 0x20);
    fVar7 = fVar17 + fVar4;
    fVar9 = fVar10 + fVar5;
    fVar15 = (float)*(undefined8 *)(a + lVar3 * 2 + 0x14);
    fVar16 = (float)((ulong)*(undefined8 *)(a + lVar3 * 2 + 0x14) >> 0x20);
    fVar18 = fVar15 + fVar20;
    fVar19 = fVar16 + fVar21;
    fVar17 = fVar17 - fVar4;
    fVar10 = fVar10 - fVar5;
    *(ulong *)(a + lVar3 * 2 + 0x10) = CONCAT44(fVar9 + fVar19,fVar7 + fVar18);
    fVar4 = *(float *)((long)rdft_w + lVar3 + 8);
    fVar5 = *(float *)((long)rdft_w + lVar3 + 0xc);
    fVar23 = -fVar5;
    fVar6 = *(float *)((long)rdft_w + lVar3 * 2 + 0x10);
    fVar8 = *(float *)((long)rdft_w + lVar3 * 2 + 0x14);
    fVar11 = *(float *)((long)rdft_w + lVar3 * 2 + 0x18);
    fVar12 = *(float *)((long)rdft_w + lVar3 * 2 + 0x1c);
    fVar13 = *(float *)((long)rdft_wk3ri_first + lVar3 + 8);
    fVar14 = *(float *)((long)rdft_wk3ri_first + lVar3 + 0xc);
    fVar15 = fVar15 - fVar20;
    fVar16 = fVar16 - fVar21;
    fVar20 = fVar17 + fVar16;
    fVar21 = fVar10 + fVar15;
    fVar10 = fVar10 - fVar15;
    fVar17 = fVar17 - fVar16;
    fVar7 = fVar7 - fVar18;
    fVar9 = fVar9 - fVar19;
    pfVar1 = a + lVar3 * 2 + 0x12;
    *pfVar1 = fVar21 * -fVar8 + fVar17 * fVar6;
    pfVar1[1] = fVar17 * fVar8 + fVar21 * fVar6;
    pfVar1[2] = fVar9 * fVar23 + fVar7 * fVar4;
    pfVar1[3] = fVar7 * fVar5 + fVar9 * fVar4;
    fVar8 = (float)*(undefined8 *)(a + lVar3 * 2 + 0x18);
    fVar7 = (float)((ulong)*(undefined8 *)(a + lVar3 * 2 + 0x18) >> 0x20);
    fVar5 = (float)*(undefined8 *)(a + lVar3 * 2 + 0x1a);
    fVar15 = fVar8 + fVar5;
    fVar6 = (float)((ulong)*(undefined8 *)(a + lVar3 * 2 + 0x1a) >> 0x20);
    fVar16 = fVar7 + fVar6;
    fVar21 = (float)*(undefined8 *)(a + lVar3 * 2 + 0x1e);
    fVar22 = (float)((ulong)*(undefined8 *)(a + lVar3 * 2 + 0x1e) >> 0x20);
    fVar9 = (float)*(undefined8 *)(a + lVar3 * 2 + 0x1c);
    fVar17 = (float)((ulong)*(undefined8 *)(a + lVar3 * 2 + 0x1c) >> 0x20);
    fVar18 = fVar9 + fVar21;
    fVar19 = fVar17 + fVar22;
    fVar8 = fVar8 - fVar5;
    fVar7 = fVar7 - fVar6;
    pfVar1 = a + lVar3 * 2 + 0x16;
    *pfVar1 = fVar13 * fVar20 + -fVar14 * fVar10;
    pfVar1[1] = fVar13 * fVar10 + fVar14 * fVar20;
    pfVar1[2] = fVar15 + fVar18;
    pfVar1[3] = fVar16 + fVar19;
    fVar5 = *(float *)((long)rdft_wk3ri_second + lVar3 + 8);
    fVar6 = *(float *)((long)rdft_wk3ri_second + lVar3 + 0xc);
    fVar9 = fVar9 - fVar21;
    fVar17 = fVar17 - fVar22;
    fVar13 = fVar8 + fVar17;
    fVar14 = fVar7 + fVar9;
    fVar7 = fVar7 - fVar9;
    fVar8 = fVar8 - fVar17;
    fVar15 = fVar15 - fVar18;
    fVar16 = fVar16 - fVar19;
    pfVar1 = a + lVar3 * 2 + 0x1a;
    *pfVar1 = fVar14 * -fVar12 + fVar8 * fVar11;
    pfVar1[1] = fVar8 * fVar12 + fVar14 * fVar11;
    pfVar1[2] = fVar16 * -fVar4 + fVar15 * fVar23;
    pfVar1[3] = fVar15 * fVar4 + fVar16 * fVar23;
    *(ulong *)(a + lVar3 * 2 + 0x1e) =
         CONCAT44(fVar5 * fVar7 + fVar6 * fVar13,fVar5 * fVar13 + -fVar6 * fVar7);
    lVar3 = lVar3 + 8;
    uVar2 = uVar2 + 0x10;
  } while (uVar2 < 0x70);
  return;
}

Assistant:

static void cft1st_128_C(float* a) {
  const int n = 128;
  int j, k1, k2;
  float wk1r, wk1i, wk2r, wk2i, wk3r, wk3i;
  float x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i;

  // The processing of the first set of elements was simplified in C to avoid
  // some operations (multiplication by zero or one, addition of two elements
  // multiplied by the same weight, ...).
  x0r = a[0] + a[2];
  x0i = a[1] + a[3];
  x1r = a[0] - a[2];
  x1i = a[1] - a[3];
  x2r = a[4] + a[6];
  x2i = a[5] + a[7];
  x3r = a[4] - a[6];
  x3i = a[5] - a[7];
  a[0] = x0r + x2r;
  a[1] = x0i + x2i;
  a[4] = x0r - x2r;
  a[5] = x0i - x2i;
  a[2] = x1r - x3i;
  a[3] = x1i + x3r;
  a[6] = x1r + x3i;
  a[7] = x1i - x3r;
  wk1r = rdft_w[2];
  x0r = a[8] + a[10];
  x0i = a[9] + a[11];
  x1r = a[8] - a[10];
  x1i = a[9] - a[11];
  x2r = a[12] + a[14];
  x2i = a[13] + a[15];
  x3r = a[12] - a[14];
  x3i = a[13] - a[15];
  a[8] = x0r + x2r;
  a[9] = x0i + x2i;
  a[12] = x2i - x0i;
  a[13] = x0r - x2r;
  x0r = x1r - x3i;
  x0i = x1i + x3r;
  a[10] = wk1r * (x0r - x0i);
  a[11] = wk1r * (x0r + x0i);
  x0r = x3i + x1r;
  x0i = x3r - x1i;
  a[14] = wk1r * (x0i - x0r);
  a[15] = wk1r * (x0i + x0r);
  k1 = 0;
  for (j = 16; j < n; j += 16) {
    k1 += 2;
    k2 = 2 * k1;
    wk2r = rdft_w[k1 + 0];
    wk2i = rdft_w[k1 + 1];
    wk1r = rdft_w[k2 + 0];
    wk1i = rdft_w[k2 + 1];
    wk3r = rdft_wk3ri_first[k1 + 0];
    wk3i = rdft_wk3ri_first[k1 + 1];
    x0r = a[j + 0] + a[j + 2];
    x0i = a[j + 1] + a[j + 3];
    x1r = a[j + 0] - a[j + 2];
    x1i = a[j + 1] - a[j + 3];
    x2r = a[j + 4] + a[j + 6];
    x2i = a[j + 5] + a[j + 7];
    x3r = a[j + 4] - a[j + 6];
    x3i = a[j + 5] - a[j + 7];
    a[j + 0] = x0r + x2r;
    a[j + 1] = x0i + x2i;
    x0r -= x2r;
    x0i -= x2i;
    a[j + 4] = wk2r * x0r - wk2i * x0i;
    a[j + 5] = wk2r * x0i + wk2i * x0r;
    x0r = x1r - x3i;
    x0i = x1i + x3r;
    a[j + 2] = wk1r * x0r - wk1i * x0i;
    a[j + 3] = wk1r * x0i + wk1i * x0r;
    x0r = x1r + x3i;
    x0i = x1i - x3r;
    a[j + 6] = wk3r * x0r - wk3i * x0i;
    a[j + 7] = wk3r * x0i + wk3i * x0r;
    wk1r = rdft_w[k2 + 2];
    wk1i = rdft_w[k2 + 3];
    wk3r = rdft_wk3ri_second[k1 + 0];
    wk3i = rdft_wk3ri_second[k1 + 1];
    x0r = a[j + 8] + a[j + 10];
    x0i = a[j + 9] + a[j + 11];
    x1r = a[j + 8] - a[j + 10];
    x1i = a[j + 9] - a[j + 11];
    x2r = a[j + 12] + a[j + 14];
    x2i = a[j + 13] + a[j + 15];
    x3r = a[j + 12] - a[j + 14];
    x3i = a[j + 13] - a[j + 15];
    a[j + 8] = x0r + x2r;
    a[j + 9] = x0i + x2i;
    x0r -= x2r;
    x0i -= x2i;
    a[j + 12] = -wk2i * x0r - wk2r * x0i;
    a[j + 13] = -wk2i * x0i + wk2r * x0r;
    x0r = x1r - x3i;
    x0i = x1i + x3r;
    a[j + 10] = wk1r * x0r - wk1i * x0i;
    a[j + 11] = wk1r * x0i + wk1i * x0r;
    x0r = x1r + x3i;
    x0i = x1i - x3r;
    a[j + 14] = wk3r * x0r - wk3i * x0i;
    a[j + 15] = wk3r * x0i + wk3i * x0r;
  }
}